

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O2

uint32_t __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::DecodeSymbol
          (MeshEdgebreakerTraversalPredictiveDecoder *this)

{
  bool bVar1;
  uint32_t uVar2;
  
  if (this->predicted_symbol_ != -1) {
    bVar1 = RAnsBitDecoder::DecodeNextBit(&this->prediction_decoder_);
    if (bVar1) {
      uVar2 = this->predicted_symbol_;
      goto LAB_001289d9;
    }
  }
  uVar2 = MeshEdgebreakerTraversalDecoder::DecodeSymbol
                    (&this->super_MeshEdgebreakerTraversalDecoder);
LAB_001289d9:
  this->last_symbol_ = uVar2;
  return uVar2;
}

Assistant:

inline uint32_t DecodeSymbol() {
    // First check if we have a predicted symbol.
    if (predicted_symbol_ != -1) {
      // Double check that the predicted symbol was predicted correctly.
      if (prediction_decoder_.DecodeNextBit()) {
        last_symbol_ = predicted_symbol_;
        return predicted_symbol_;
      }
    }
    // We don't have a predicted symbol or the symbol was mis-predicted.
    // Decode it directly.
    last_symbol_ = MeshEdgebreakerTraversalDecoder::DecodeSymbol();
    return last_symbol_;
  }